

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9789:35)>
::setValue(BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9789:35)>
           *this,string *arg)

{
  ParserResult *in_RDI;
  string *in_stack_00000008;
  
  invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__6>
            ((anon_class_8_1_50637480_for_m_lambda *)arg,in_stack_00000008);
  return in_RDI;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }